

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::PointLightSource::writeTo(PointLightSource *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *__buf;
  BinaryWriter *in_RSI;
  vec3f *in_RDI;
  
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_RDI);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_RDI);
  BinaryWriter::write(in_RSI,(int)in_RDI + 0x30,__buf,in_RCX);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_RDI);
  return 0x49;
}

Assistant:

int PointLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(from);
    binary.write(I);
    binary.write(Ispectrum);
    binary.write(scale);
    return TYPE_POINT_LIGHT_SOURCE;
  }